

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialog::done(QFontDialog *this,int result)

{
  bool bVar1;
  QFontDialogPrivate *pQVar2;
  ulong uVar3;
  QObject *this_00;
  char *pcVar4;
  int in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QFontDialogPrivate *d;
  QFont selectedFont;
  QObject *in_stack_ffffffffffffffa8;
  QFont *in_stack_ffffffffffffffb0;
  int r;
  undefined4 in_stack_ffffffffffffffc8;
  QFont local_28 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QFontDialog *)0x79683e);
  if (in_ESI == 1) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    currentFont((QFontDialog *)CONCAT44(1,in_stack_ffffffffffffffc8));
    uVar3 = QFont::operator!=((QFont *)&local_18,&pQVar2->selectedFont);
    if ((uVar3 & 1) != 0) {
      currentFontChanged((QFontDialog *)in_stack_ffffffffffffffb0,(QFont *)in_stack_ffffffffffffffa8
                        );
    }
    QFont::operator=(&pQVar2->selectedFont,(QFont *)&local_18);
    r = (int)((ulong)pQVar2 >> 0x20);
    fontSelected((QFontDialog *)in_stack_ffffffffffffffb0,(QFont *)in_stack_ffffffffffffffa8);
    QFont::~QFont((QFont *)&local_18);
  }
  else {
    QFont::QFont(local_28);
    r = (int)((ulong)pQVar2 >> 0x20);
    QFont::operator=(in_stack_ffffffffffffffb0,(QFont *)in_stack_ffffffffffffffa8);
    QFont::~QFont(local_28);
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x796913);
  if (bVar1) {
    this_00 = ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x79692a);
    pcVar4 = QByteArray::operator_cast_to_char_((QByteArray *)0x796940);
    QObject::disconnect(in_RDI,"2fontSelected(QFont)",this_00,pcVar4);
    QPointer<QObject>::operator=((QPointer<QObject> *)this_00,in_stack_ffffffffffffffa8);
  }
  QByteArray::clear();
  QDialog::done((QDialog *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),r);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDialog::done(int result)
{
    Q_D(QFontDialog);
    if (result == Accepted) {
        // We check if this is the same font we had before, if so we emit currentFontChanged
        QFont selectedFont = currentFont();
        if (selectedFont != d->selectedFont)
            emit(currentFontChanged(selectedFont));
        d->selectedFont = selectedFont;
        emit fontSelected(d->selectedFont);
    } else
        d->selectedFont = QFont();
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, SIGNAL(fontSelected(QFont)),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
    QDialog::done(result);
}